

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

DdLocalCache * cuddLocalCacheInit(DdManager *manager,uint keySize,uint cacheSize,uint maxCacheSize)

{
  int iVar1;
  uint uVar2;
  DdLocalCacheItem *pDVar3;
  uint local_3c;
  uint local_38;
  int logSize;
  DdLocalCache *cache;
  uint maxCacheSize_local;
  uint cacheSize_local;
  uint keySize_local;
  DdManager *manager_local;
  
  manager_local = (DdManager *)malloc(0x48);
  if (manager_local == (DdManager *)0x0) {
    manager->errorCode = CUDD_MEMORY_OUT;
    manager_local = (DdManager *)0x0;
  }
  else {
    manager_local->plusinfinity = &manager->sentinel;
    *(uint *)((long)&(manager_local->sentinel).next + 4) = keySize;
    *(uint *)&(manager_local->sentinel).next = (keySize + 1) * 8;
    local_38 = cacheSize;
    if (cacheSize < manager->slots >> 1) {
      local_38 = manager->slots >> 1;
    }
    iVar1 = cuddComputeFloorLog2(local_38);
    uVar2 = 1 << ((byte)iVar1 & 0x1f);
    pDVar3 = (DdLocalCacheItem *)malloc((ulong)(uVar2 * *(uint *)&(manager_local->sentinel).next));
    *(DdLocalCacheItem **)&manager_local->sentinel = pDVar3;
    if (*(DdLocalCacheItem **)&manager_local->sentinel == (DdLocalCacheItem *)0x0) {
      manager->errorCode = CUDD_MEMORY_OUT;
      if (manager_local != (DdManager *)0x0) {
        free(manager_local);
      }
      manager_local = (DdManager *)0x0;
    }
    else {
      *(uint *)&(manager_local->sentinel).type = uVar2;
      *(int *)((long)&(manager_local->sentinel).type + 4) = 0x20 - iVar1;
      local_3c = maxCacheSize;
      if (manager->slots < maxCacheSize) {
        local_3c = manager->slots;
      }
      *(uint *)&manager_local->zero = local_3c;
      (manager_local->sentinel).Id = (ABC_INT64_T)manager->minHit;
      *(double *)((long)&(manager_local->sentinel).type + 8) =
           (double)(int)((double)uVar2 * (double)(manager_local->sentinel).Id + 1.0);
      manager_local->one = (DdNode *)0x0;
      manager->memused =
           (ulong)(uVar2 * *(uint *)&(manager_local->sentinel).next) + 0x48 + manager->memused;
      memset(*(DdLocalCacheItem **)&manager_local->sentinel,0,
             (ulong)(uVar2 * *(uint *)&(manager_local->sentinel).next));
      cuddLocalCacheAddToList((DdLocalCache *)manager_local);
    }
  }
  return (DdLocalCache *)manager_local;
}

Assistant:

DdLocalCache *
cuddLocalCacheInit(
  DdManager * manager /* manager */,
  unsigned int  keySize /* size of the key (number of operands) */,
  unsigned int  cacheSize /* Initial size of the cache */,
  unsigned int  maxCacheSize /* Size of the cache beyond which no resizing occurs */)
{
    DdLocalCache *cache;
    int logSize;

    cache = ABC_ALLOC(DdLocalCache,1);
    if (cache == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    cache->manager = manager;
    cache->keysize = keySize;
    cache->itemsize = (keySize + 1) * sizeof(DdNode *);
#ifdef DD_CACHE_PROFILE
    cache->itemsize += sizeof(ptrint);
#endif
    logSize = cuddComputeFloorLog2(ddMax(cacheSize,manager->slots/2));
    cacheSize = 1 << logSize;
    cache->item = (DdLocalCacheItem *)
        ABC_ALLOC(char, cacheSize * cache->itemsize);
    if (cache->item == NULL) {
        manager->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(cache);
        return(NULL);
    }
    cache->slots = cacheSize;
    cache->shift = sizeof(int) * 8 - logSize;
    cache->maxslots = ddMin(maxCacheSize,manager->slots);
    cache->minHit = manager->minHit;
    /* Initialize to avoid division by 0 and immediate resizing. */
    cache->lookUps = (double) (int) (cacheSize * cache->minHit + 1);
    cache->hits = 0;
    manager->memused += cacheSize * cache->itemsize + sizeof(DdLocalCache);

    /* Initialize the cache. */
    memset(cache->item, 0, (size_t)(cacheSize * cache->itemsize));

    /* Add to manager's list of local caches for GC. */
    cuddLocalCacheAddToList(cache);

    return(cache);

}